

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

int coda_type_set_bit_size_expression(coda_type *type,coda_expression *bit_size_expr)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (type == (coda_type *)0x0) {
    pcVar2 = "type argument is NULL (%s:%u)";
    uVar1 = 0x36d;
  }
  else {
    if (bit_size_expr != (coda_expression *)0x0) {
      if (type->size_expr == (coda_expression *)0x0) {
        if (type->type_class < coda_integer_class) {
          if (type->bit_size < 1) {
LAB_00162a4d:
            type->size_expr = bit_size_expr;
            type->bit_size = -1;
            return 0;
          }
        }
        else if (type->bit_size < 0) goto LAB_00162a4d;
        pcVar2 = "type already has a bit size";
      }
      else {
        pcVar2 = "type already has a bit size expression";
      }
      coda_set_error(-400,pcVar2);
      return -1;
    }
    pcVar2 = "bit_size_expr argument is NULL (%s:%u)";
    uVar1 = 0x372;
  }
  coda_set_error(-100,pcVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar1);
  return -1;
}

Assistant:

int coda_type_set_bit_size_expression(coda_type *type, coda_expression *bit_size_expr)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (bit_size_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_size_expr argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->size_expr != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a bit size expression");
        return -1;
    }
    if (type->type_class == coda_record_class || type->type_class == coda_array_class)
    {
        /* for compound types we also allow setting a bit size expression if the bit_size is currently 0 */
        if (type->bit_size > 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a bit size");
            return -1;
        }
    }
    else
    {
        if (type->bit_size >= 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "type already has a bit size");
            return -1;
        }
    }
    type->size_expr = bit_size_expr;
    type->bit_size = -1;
    return 0;
}